

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          CartesianSpeakerPosition *pos,bool isLfe,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  reference_const_type pdVar8;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *this_00;
  reference pvVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  pair<int,_double> pVar12;
  value_type local_3e8;
  RowXpr local_3d8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_3a0;
  RealScalar local_358;
  double distance;
  RowXpr local_318;
  RowXpr local_2e0;
  RowXpr local_2a8;
  RowXpr local_270;
  RowXpr local_238;
  undefined1 local_200 [8];
  Channel channel;
  int i;
  double ZMax;
  double ZMin;
  double YMax;
  double YMin;
  double XMax;
  double XMin;
  CartesianSpeakerPosition local_128;
  Vector3d local_60;
  Matrix<double,1,3,1,1,3> local_48 [8];
  RowVector3d cartPosition;
  double tol_local;
  bool isLfe_local;
  CartesianSpeakerPosition *pos_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *candidates;
  
  cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [2] = tol;
  CartesianSpeakerPosition::CartesianSpeakerPosition(&local_128,pos);
  toCartesianVector3d(&local_60,&local_128);
  Eigen::Matrix<double,1,3,1,1,3>::Matrix<Eigen::Matrix<double,3,1,0,3,1>>
            (local_48,(EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_60);
  CartesianSpeakerPosition::~CartesianSpeakerPosition(&local_128);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (__return_storage_ptr__);
  pdVar8 = boost::get_optional_value_or<double>(&pos->XMin,&pos->X);
  dVar1 = *pdVar8;
  pdVar8 = boost::get_optional_value_or<double>(&pos->XMax,&pos->X);
  dVar2 = *pdVar8;
  pdVar8 = boost::get_optional_value_or<double>(&pos->YMin,&pos->Y);
  dVar3 = *pdVar8;
  pdVar8 = boost::get_optional_value_or<double>(&pos->YMax,&pos->Y);
  dVar4 = *pdVar8;
  pdVar8 = boost::get_optional_value_or<double>(&pos->ZMin,&pos->Z);
  dVar5 = *pdVar8;
  pdVar8 = boost::get_optional_value_or<double>(&pos->ZMax,&pos->Z);
  dVar6 = *pdVar8;
  for (channel._140_4_ = 0; (int)channel._140_4_ < this->_nChannels;
      channel._140_4_ = channel._140_4_ + 1) {
    this_00 = Layout::channels(&this->_layout);
    pvVar9 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::operator[]
                       (this_00,(long)(int)channel._140_4_);
    Channel::Channel((Channel *)local_200,pvVar9);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Array<bool,__1,_1,_0,__1,_1>,_1> *)&this->_isLfe,
                         (long)(int)channel._140_4_);
    if (isLfe == (bool)(*pSVar10 & 1U)) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_238,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions,
                 (long)(int)channel._140_4_);
      pSVar11 = Eigen::
                DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                              *)&local_238,0);
      bVar7 = false;
      if (dVar1 <= *pSVar11 +
                   cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array[2]) {
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_270,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions,
                   (long)(int)channel._140_4_);
        pSVar11 = Eigen::
                  DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                                *)&local_270,0);
        bVar7 = false;
        if (*pSVar11 -
            cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[2] <= dVar2) {
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                    (&local_2a8,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions,
                     (long)(int)channel._140_4_);
          pSVar11 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                                  *)&local_2a8,1);
          bVar7 = false;
          if (dVar3 <= *pSVar11 +
                       cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage.m_data.array[2]) {
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                      (&local_2e0,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions,
                       (long)(int)channel._140_4_);
            pSVar11 = Eigen::
                      DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                      ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                                    *)&local_2e0,1);
            bVar7 = false;
            if (*pSVar11 -
                cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[2] <= dVar4) {
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                        (&local_318,
                         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions,
                         (long)(int)channel._140_4_);
              pSVar11 = Eigen::
                        DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                        ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                                      *)&local_318,2);
              bVar7 = false;
              if (dVar5 <= *pSVar11 +
                           cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                           .m_storage.m_data.array[2]) {
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                          ((RowXpr *)&distance,
                           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions
                           ,(long)(int)channel._140_4_);
                pSVar11 = Eigen::
                          DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                          ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                                        *)&distance,2);
                bVar7 = *pSVar11 -
                        cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                        m_storage.m_data.array[2] <= dVar6;
              }
            }
          }
        }
      }
      if (bVar7) {
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_3d8,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions,
                   (long)(int)channel._140_4_);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator-
                  (&local_3a0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
                   &local_3d8,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_48);
        local_358 = Eigen::
                    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                            *)&local_3a0);
        pVar12 = std::make_pair<int&,double&>((int *)&channel.field_0x8c,&local_358);
        local_3e8.second = pVar12.second;
        local_3e8.first = pVar12.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  (__return_storage_ptr__,&local_3e8);
      }
    }
    Channel::~Channel((Channel *)local_200);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const CartesianSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;

    double XMin = boost::get_optional_value_or(pos.XMin, pos.X);
    double XMax = boost::get_optional_value_or(pos.XMax, pos.X);
    double YMin = boost::get_optional_value_or(pos.YMin, pos.Y);
    double YMax = boost::get_optional_value_or(pos.YMax, pos.Y);
    double ZMin = boost::get_optional_value_or(pos.ZMin, pos.Z);
    double ZMax = boost::get_optional_value_or(pos.ZMax, pos.Z);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if (_positions.row(i)(0) + tol >= XMin &&
            _positions.row(i)(0) - tol <= XMax &&
            _positions.row(i)(1) + tol >= YMin &&
            _positions.row(i)(1) - tol <= YMax &&
            _positions.row(i)(2) + tol >= ZMin &&
            _positions.row(i)(2) - tol <= ZMax) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }